

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManIsoStrashReduce2(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *__ptr;
  Vec_Int_t *in_RAX;
  Vec_Wec_t *vSupps;
  Gia_Man_t *pGVar3;
  long lVar4;
  Vec_Int_t *vCoMap;
  Vec_Int_t *local_38;
  
  local_38 = in_RAX;
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  pGVar3 = Gia_ManDupStrashReduce(p,vSupps,&local_38);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
    local_38->pArray = (int *)0x0;
  }
  if (local_38 != (Vec_Int_t *)0x0) {
    free(local_38);
  }
  iVar1 = vSupps->nCap;
  if (0 < (long)iVar1) {
    pVVar2 = vSupps->pArray;
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->pArray + lVar4);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar2->pArray + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar4);
  }
  if (vSupps->pArray != (Vec_Int_t *)0x0) {
    free(vSupps->pArray);
    vSupps->pArray = (Vec_Int_t *)0x0;
  }
  vSupps->nCap = 0;
  vSupps->nSize = 0;
  free(vSupps);
  *pvPosEquivs = (Vec_Ptr_t *)0x0;
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce2( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Int_t * vCoMap;
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Gia_Man_t * pNew = Gia_ManDupStrashReduce( p, vSupps, &vCoMap );
    Vec_IntFree( vCoMap );
    Vec_WecFree( vSupps );
    *pvPosEquivs = NULL;
    return pNew;
}